

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

void completePacketData(MQTTCODEC_INSTANCE *codecData)

{
  MQTTCODEC_INSTANCE *codecData_local;
  
  if (codecData->packetComplete != (ON_PACKET_COMPLETE_CALLBACK)0x0) {
    (*codecData->packetComplete)
              (codecData->callContext,codecData->currPacket,codecData->headerFlags,
               codecData->headerData);
  }
  codecData->currPacket = UNKNOWN_TYPE;
  codecData->codecState = CODEC_STATE_FIXED_HEADER;
  codecData->headerFlags = 0;
  BUFFER_delete(codecData->headerData);
  codecData->headerData = (BUFFER_HANDLE)0x0;
  return;
}

Assistant:

static void completePacketData(MQTTCODEC_INSTANCE* codecData)
{
    if (codecData->packetComplete != NULL)
    {
        codecData->packetComplete(codecData->callContext, codecData->currPacket, codecData->headerFlags, codecData->headerData);
    }

    // Clean up data
    codecData->currPacket = UNKNOWN_TYPE;
    codecData->codecState = CODEC_STATE_FIXED_HEADER;
    codecData->headerFlags = 0;
    BUFFER_delete(codecData->headerData);
    codecData->headerData = NULL;
}